

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O2

void __thiscall chrono::ChAssembly::RemoveAllOtherPhysicsItems(ChAssembly *this)

{
  pointer psVar1;
  element_type *peVar2;
  ChSystem *pCVar3;
  shared_ptr<chrono::ChPhysicsItem> *item;
  pointer psVar4;
  
  psVar1 = (this->otherphysicslist).
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (this->otherphysicslist).
                super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    peVar2 = (psVar4->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar2->super_ChObj)._vptr_ChObj[6])(peVar2,0);
  }
  std::
  vector<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ::clear(&this->otherphysicslist);
  pCVar3 = (this->super_ChPhysicsItem).system;
  if (pCVar3 != (ChSystem *)0x0) {
    pCVar3->is_updated = false;
  }
  return;
}

Assistant:

void ChAssembly::RemoveAllOtherPhysicsItems() {
    for (auto& item : otherphysicslist) {
        item->SetSystem(nullptr);
    }
    otherphysicslist.clear();

    if (system)
        system->is_updated = false;
}